

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O2

Result RunAllExports(Ptr *instance,Errors *errors)

{
  undefined8 *puVar1;
  Result RVar2;
  FuncType *pFVar3;
  ExportDesc *export_;
  undefined8 *puVar4;
  string_view name;
  Ptr trap;
  Values results;
  Values params;
  RefPtr<wabt::interp::Func> func;
  RefPtr<wabt::interp::Module> module;
  Ptr *in_stack_ffffffffffffff30;
  Enum local_c4;
  RefPtr<wabt::interp::Trap> local_b8;
  _Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_98;
  undefined1 local_78 [72];
  
  wabt::interp::RefPtr<wabt::interp::Module>::RefPtr
            ((RefPtr<wabt::interp::Module> *)(local_78 + 0x30),&s_store,
             (Ref)(instance->obj_->module_).index);
  puVar4 = *(undefined8 **)(local_78._48_8_ + 0xe8);
  puVar1 = *(undefined8 **)(local_78._48_8_ + 0xf0);
  local_c4 = Ok;
  for (; puVar4 != puVar1; puVar4 = puVar4 + 6) {
    if (((ExternType *)puVar4[4])->kind == First) {
      pFVar3 = wabt::cast<wabt::interp::FuncType,wabt::interp::ExternType>((ExternType *)puVar4[4]);
      if ((pFVar3->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pFVar3->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (s_trace_stream != (Stream *)0x0) {
          wabt::Stream::Writef(s_trace_stream,">>> running export \"%s\":\n",*puVar4);
        }
        wabt::interp::RefPtr<wabt::interp::Func>::RefPtr
                  ((RefPtr<wabt::interp::Func> *)(local_78 + 0x18),&s_store,
                   (Ref)(instance->obj_->funcs_).
                        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                        _M_impl.super__Vector_impl_data._M_start[*(uint *)(puVar4 + 5)].index);
        local_78._16_8_ = (pointer)0x0;
        local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78._0_8_ = (_func_int **)0x0;
        local_78._8_8_ = 0;
        local_b8.root_index_ = 0;
        local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.obj_ = (Trap *)0x0;
        local_b8.store_ = (Store *)0x0;
        RVar2 = wabt::interp::Func::Call
                          ((Func *)local_78._24_8_,&s_store,(Values *)local_78,(Values *)&local_98,
                           &local_b8,s_trace_stream);
        local_c4 = (Enum)(RVar2.enum_ == Error || local_c4 == Error);
        name.size_ = (size_type)pFVar3;
        name.data_ = (char *)puVar4[1];
        wabt::interp::WriteCall
                  ((interp *)
                   s_stdout_stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,(Stream *)*puVar4,
                   name,(FuncType *)local_78,(Values *)&local_98,(Values *)&local_b8,
                   in_stack_ffffffffffffff30);
        wabt::interp::RefPtr<wabt::interp::Trap>::reset(&local_b8);
        std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                  (&local_98);
        std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                  ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                   local_78);
        wabt::interp::RefPtr<wabt::interp::Func>::reset
                  ((RefPtr<wabt::interp::Func> *)(local_78 + 0x18));
      }
    }
  }
  wabt::interp::RefPtr<wabt::interp::Module>::reset
            ((RefPtr<wabt::interp::Module> *)(local_78 + 0x30));
  return (Result)local_c4;
}

Assistant:

Result RunAllExports(const Instance::Ptr& instance, Errors* errors) {
  Result result = Result::Ok;

  auto module = s_store.UnsafeGet<Module>(instance->module());
  auto&& module_desc = module->desc();

  for (auto&& export_ : module_desc.exports) {
    if (export_.type.type->kind != ExternalKind::Func) {
      continue;
    }
    auto* func_type = cast<FuncType>(export_.type.type.get());
    if (func_type->params.empty()) {
      if (s_trace_stream) {
        s_trace_stream->Writef(">>> running export \"%s\":\n",
                               export_.type.name.c_str());
      }
      auto func = s_store.UnsafeGet<Func>(instance->funcs()[export_.index]);
      Values params;
      Values results;
      Trap::Ptr trap;
      result |= func->Call(s_store, params, results, &trap, s_trace_stream);
      WriteCall(s_stdout_stream.get(), export_.type.name, *func_type, params,
                results, trap);
    }
  }

  return result;
}